

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t *
container_or(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  run_container_t *prVar2;
  run_container_t *prVar3;
  bitset_container_t *dst;
  uint uVar4;
  undefined7 in_register_00000031;
  array_container_t *paVar5;
  container_t *answer;
  run_container_t *local_30;
  
  uVar4 = (uint)CONCAT71(in_register_00000031,type1);
  if (uVar4 == 4) {
    uVar4 = (uint)*(byte *)((long)c1 + 8);
    if (*(byte *)((long)c1 + 8) == 4) goto LAB_0010ad87;
    c1 = *c1;
  }
  if (type2 == '\x04') {
    type2 = *(byte *)((long)c2 + 8);
    if (type2 == 4) {
LAB_0010ad87:
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    c2 = *c2;
  }
  local_30 = (run_container_t *)0x0;
  switch((uint)type2 + (uVar4 & 0xff) * 4) {
  case 5:
    dst = bitset_container_create();
    bitset_container_or((bitset_container_t *)c1,(bitset_container_t *)c2,dst);
    goto LAB_0010ad37;
  case 6:
    dst = bitset_container_create();
    paVar5 = (array_container_t *)c1;
    break;
  case 7:
    if (((((array_container_t *)c2)->cardinality == 1) && (*((array_container_t *)c2)->array == 0))
       && (((array_container_t *)c2)->array[1] == 0xffff)) {
      prVar2 = (run_container_t *)calloc(1,0x10);
      *result_type = '\x03';
LAB_0010ad7d:
      run_container_copy((run_container_t *)c2,prVar2);
      return prVar2;
    }
    dst = bitset_container_create();
    paVar5 = (array_container_t *)c1;
    goto LAB_0010ad2f;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1470,
                  "container_t *container_or(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    dst = bitset_container_create();
    paVar5 = (array_container_t *)c2;
    c2 = c1;
    break;
  case 10:
    _Var1 = array_array_container_union((array_container_t *)c1,(array_container_t *)c2,&local_30);
    *result_type = '\x02' - _Var1;
    return local_30;
  case 0xb:
    prVar2 = (run_container_t *)calloc(1,0x10);
    paVar5 = (array_container_t *)c2;
    goto LAB_0010acbd;
  case 0xd:
    if (((((array_container_t *)c1)->cardinality == 1) && (*((array_container_t *)c1)->array == 0))
       && (((array_container_t *)c1)->array[1] == 0xffff)) {
      prVar2 = (run_container_t *)calloc(1,0x10);
      *result_type = '\x03';
      c2 = c1;
      goto LAB_0010ad7d;
    }
    dst = bitset_container_create();
    paVar5 = (array_container_t *)c2;
    c2 = c1;
LAB_0010ad2f:
    run_bitset_container_union((run_container_t *)c2,(bitset_container_t *)paVar5,dst);
    goto LAB_0010ad37;
  case 0xe:
    prVar2 = (run_container_t *)calloc(1,0x10);
    paVar5 = (array_container_t *)c1;
    c1 = c2;
LAB_0010acbd:
    array_run_container_union((array_container_t *)c1,(run_container_t *)paVar5,prVar2);
LAB_0010acc5:
    prVar3 = (run_container_t *)convert_run_to_efficient_container(prVar2,result_type);
    if (prVar3 == prVar2) {
      return prVar3;
    }
    run_container_free(prVar2);
    return prVar3;
  case 0xf:
    prVar2 = (run_container_t *)calloc(1,0x10);
    run_container_union((run_container_t *)c1,(run_container_t *)c2,prVar2);
    *result_type = '\x03';
    goto LAB_0010acc5;
  }
  array_bitset_container_union((array_container_t *)c2,(bitset_container_t *)paVar5,dst);
LAB_0010ad37:
  *result_type = '\x01';
  return dst;
}

Assistant:

static inline container_t *container_or(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            result = bitset_container_create();
            bitset_container_or(const_CAST_bitset(c1),
                                const_CAST_bitset(c2),
                                CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_union(
                                const_CAST_array(c1),
                                const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            result = run_container_create();
            run_container_union(const_CAST_run(c1),
                                const_CAST_run(c2),
                                CAST_run(result));
            *result_type = RUN_CONTAINER_TYPE;
            // todo: could be optimized since will never convert to array
            result = convert_run_to_efficient_container_and_free(
                            CAST_run(result), result_type);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            result = bitset_container_create();
            array_bitset_container_union(const_CAST_array(c2),
                                         const_CAST_bitset(c1),
                                         CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            result = bitset_container_create();
            array_bitset_container_union(const_CAST_array(c1),
                                         const_CAST_bitset(c2),
                                         CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = run_container_create();
                *result_type = RUN_CONTAINER_TYPE;
                run_container_copy(const_CAST_run(c2),
                                   CAST_run(result));
                return result;
            }
            result = bitset_container_create();
            run_bitset_container_union(const_CAST_run(c2),
                                       const_CAST_bitset(c1),
                                       CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            if (run_container_is_full(const_CAST_run(c1))) {
                result = run_container_create();
                *result_type = RUN_CONTAINER_TYPE;
                run_container_copy(const_CAST_run(c1),
                                   CAST_run(result));
                return result;
            }
            result = bitset_container_create();
            run_bitset_container_union(const_CAST_run(c1),
                                       const_CAST_bitset(c2),
                                       CAST_bitset(result));
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            result = run_container_create();
            array_run_container_union(const_CAST_array(c1),
                                      const_CAST_run(c2),
                                      CAST_run(result));
            result = convert_run_to_efficient_container_and_free(
                            CAST_run(result), result_type);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            result = run_container_create();
            array_run_container_union(const_CAST_array(c2),
                                      const_CAST_run(c1),
                                      CAST_run(result));
            result = convert_run_to_efficient_container_and_free(
                            CAST_run(result), result_type);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;  // unreached
    }
}